

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O1

QString * __thiscall QUndoStack::redoText(QString *__return_storage_ptr__,QUndoStack *this)

{
  long lVar1;
  Data *pDVar2;
  
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0xa0) == 0) && ((long)*(int *)(lVar1 + 0xa8) < *(long *)(lVar1 + 0x88))) {
    lVar1 = *(long *)(*(long *)(*(long *)(lVar1 + 0x80) + (long)*(int *)(lVar1 + 0xa8) * 8) + 8);
    pDVar2 = *(Data **)(lVar1 + 0x30);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x38);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x40);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QUndoStack::redoText() const
{
    Q_D(const QUndoStack);
    if (!d->macro_stack.isEmpty())
        return QString();
    if (d->index < d->command_list.size())
        return d->command_list.at(d->index)->actionText();
    return QString();
}